

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_sq_linjection_infos.cc
# Opt level: O3

int __thiscall
aliyun::Rds::DescribeSQLInjectionInfos
          (Rds *this,RdsDescribeSQLInjectionInfosRequestType *req,
          RdsDescribeSQLInjectionInfosResponseType *response,RdsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_600;
  Value local_5e0;
  RdsDescribeSQLInjectionInfosResponseType *local_5c8;
  long *local_5c0;
  long local_5b8;
  long local_5b0 [2];
  string local_5a0;
  undefined1 local_580 [32];
  _Alloc_hider local_560;
  size_type local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  _Alloc_hider local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  _Alloc_hider local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  _Alloc_hider local_4e0;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Alloc_hider local_4c0;
  size_type local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  local_5a0._M_string_length = 0;
  local_5a0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_5c0 = local_5b0;
  local_5c8 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_580);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_600);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_5e0);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_5c0,local_5b8 + (long)local_5c0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_4a0.field_2._M_allocated_capacity = *psVar13;
    local_4a0.field_2._8_8_ = plVar8[3];
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  }
  else {
    local_4a0.field_2._M_allocated_capacity = *psVar13;
    local_4a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_4a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_5e0,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"DescribeSQLInjectionInfos","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->db_instance_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"DBInstanceId","");
    pcVar2 = (req->db_instance_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->db_instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->start_time)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"StartTime","");
    pcVar2 = (req->start_time)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->start_time)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->end_time)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"EndTime","");
    pcVar2 = (req->end_time)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar2,pcVar2 + (req->end_time)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"PageNumber","");
    pcVar2 = (req->page_number)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar2,pcVar2 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_580);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_5a0);
    if (((0 < iVar4) && (local_5a0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_5a0,&local_5e0,true), bVar3)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_5e0,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_580,pVVar10);
        }
        else {
          local_580._0_8_ = local_580 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_580,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_580);
        pcVar2 = local_580 + 0x10;
        if ((pointer)local_580._0_8_ != pcVar2) {
          operator_delete((void *)local_580._0_8_,CONCAT71(local_580._17_7_,local_580[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_5e0,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_580,pVVar10);
        }
        else {
          local_580._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_580,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_580);
        if ((pointer)local_580._0_8_ != pcVar2) {
          operator_delete((void *)local_580._0_8_,CONCAT71(local_580._17_7_,local_580[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_5e0,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_580,pVVar10);
        }
        else {
          local_580._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_580,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_580);
        if ((pointer)local_580._0_8_ != pcVar2) {
          operator_delete((void *)local_580._0_8_,CONCAT71(local_580._17_7_,local_580[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_5e0,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_580,pVVar10);
        }
        else {
          local_580._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_580,anon_var_dwarf_58089a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_580);
        if ((pointer)local_580._0_8_ != pcVar2) {
          operator_delete((void *)local_580._0_8_,CONCAT71(local_580._17_7_,local_580[0x10]) + 1);
        }
      }
      if (local_5c8 != (RdsDescribeSQLInjectionInfosResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_5e0,"Engine");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"Engine");
          Json::Value::asString_abi_cxx11_((string *)local_580,pVVar10);
          std::__cxx11::string::operator=((string *)&local_5c8->engine,(string *)local_580);
          if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
            operator_delete((void *)local_580._0_8_,CONCAT71(local_580._17_7_,local_580[0x10]) + 1);
          }
        }
        bVar3 = Json::Value::isMember(&local_5e0,"TotalRecordCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"TotalRecordCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_5c8->total_record_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_5e0,"PageNumber");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"PageNumber");
          IVar5 = Json::Value::asInt(pVVar10);
          local_5c8->page_number = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_5e0,"PageRecordCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"PageRecordCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_5c8->page_record_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_5e0,"Items");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_5e0,"Items");
          bVar3 = Json::Value::isMember(pVVar10,"SQLInjectionInfo");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_5e0,"Items");
            pVVar10 = Json::Value::operator[](pVVar10,"SQLInjectionInfo");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              index = 0;
              do {
                local_580._0_8_ = local_580 + 0x10;
                local_580._8_8_ = 0;
                local_580[0x10] = '\0';
                local_560._M_p = (pointer)&local_550;
                local_558 = 0;
                local_550._M_local_buf[0] = '\0';
                local_540._M_p = (pointer)&local_530;
                local_538 = 0;
                local_530._M_local_buf[0] = '\0';
                local_520._M_p = (pointer)&local_510;
                local_518 = 0;
                local_510._M_local_buf[0] = '\0';
                local_500._M_p = (pointer)&local_4f0;
                local_4f8 = 0;
                local_4f0._M_local_buf[0] = '\0';
                local_4e0._M_p = (pointer)&local_4d0;
                local_4d8 = 0;
                local_4d0._M_local_buf[0] = '\0';
                local_4c0._M_p = (pointer)&local_4b0;
                local_4b8 = 0;
                local_4b0._M_local_buf[0] = '\0';
                pVVar11 = Json::Value::operator[](pVVar10,index);
                bVar3 = Json::Value::isMember(pVVar11,"DBName");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"DBName");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)local_580,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"SQLText");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"SQLText");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_560,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"LatencyTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"LatencyTime");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_540,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"HostAddress");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"HostAddress");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_520,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ExecuteTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ExecuteTime");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_500,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"AccountName");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"AccountName");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"EffectRowCount");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"EffectRowCount");
                  Json::Value::asString_abi_cxx11_(&local_600,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_600);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_600._M_dataplus._M_p != &local_600.field_2) {
                    operator_delete(local_600._M_dataplus._M_p,
                                    local_600.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType,_std::allocator<aliyun::RdsDescribeSQLInjectionInfosSQLInjectionInfoType>_>
                ::push_back(&local_5c8->items,(value_type *)local_580);
                RdsDescribeSQLInjectionInfosSQLInjectionInfoType::
                ~RdsDescribeSQLInjectionInfosSQLInjectionInfoType
                          ((RdsDescribeSQLInjectionInfosSQLInjectionInfoType *)local_580);
                AVar6 = Json::Value::size(pVVar10);
                index = index + 1;
              } while (index < AVar6);
            }
          }
        }
      }
      goto LAB_0019a8ee;
    }
    if (error_info == (RdsErrorInfo *)0x0) goto LAB_0019a8e9;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (RdsErrorInfo *)0x0) {
LAB_0019a8e9:
      iVar4 = -1;
      goto LAB_0019a8ee;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_0019a8ee:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_5e0);
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0,local_5b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,
                    CONCAT71(local_5a0.field_2._M_allocated_capacity._1_7_,
                             local_5a0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Rds::DescribeSQLInjectionInfos(const RdsDescribeSQLInjectionInfosRequestType& req,
                      RdsDescribeSQLInjectionInfosResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeSQLInjectionInfos");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.db_instance_id.empty()) {
    req_rpc->AddRequestQuery("DBInstanceId", req.db_instance_id);
  }
  if(!req.start_time.empty()) {
    req_rpc->AddRequestQuery("StartTime", req.start_time);
  }
  if(!req.end_time.empty()) {
    req_rpc->AddRequestQuery("EndTime", req.end_time);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}